

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O0

VectorSet * AlphaVectorPlanning::ValueFunctionToVectorSet(ValueFunctionPOMDPDiscrete *V)

{
  uint uVar1;
  size_type sVar2;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_RSI;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RDI;
  double dVar3;
  Index s;
  Index i;
  size_t nrS;
  VectorSet *VS;
  undefined4 in_stack_ffffffffffffff98;
  Index in_stack_ffffffffffffff9c;
  AlphaVector *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffc8;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffffd0;
  undefined4 local_24;
  undefined4 local_20;
  
  sVar2 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(in_RSI);
  if (sVar2 == 0) {
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::matrix(in_RDI);
  }
  else {
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator[](in_RSI,0);
    uVar1 = AlphaVector::GetNrValues((AlphaVector *)0x90ae10);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(in_RSI);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::matrix(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(size_type)in_RDI);
    for (local_20 = 0; sVar2 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(in_RSI),
        local_20 != sVar2; local_20 = local_20 + 1) {
      for (local_24 = 0; local_24 != uVar1; local_24 = local_24 + 1) {
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator[](in_RSI,(ulong)local_20);
        dVar3 = AlphaVector::GetValue(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        in_stack_ffffffffffffffa0 =
             (AlphaVector *)
             boost::numeric::ublas::
             matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                           *)in_stack_ffffffffffffffa0,
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0x90aeb1);
        *(double *)in_stack_ffffffffffffffa0 = dVar3;
      }
    }
  }
  return in_RDI;
}

Assistant:

VectorSet AlphaVectorPlanning::ValueFunctionToVectorSet(const ValueFunctionPOMDPDiscrete& V)
{
    if(V.size()==0)
        return(VectorSet());
    else
    {
        size_t nrS=V[0].GetNrValues();
        VectorSet VS(V.size(),nrS);
        for(Index i=0;i!=V.size();++i)
            for(Index s=0;s!=nrS;++s)
                VS(i,s)=V[i].GetValue(s);
        return(VS);
    }
}